

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O0

bool double_conversion::Advance<char_const*>(char **it,uc16 separator,int base,char **end)

{
  bool bVar1;
  long *in_RCX;
  int in_EDX;
  ushort in_SI;
  long *in_RDI;
  bool local_1;
  
  if (in_SI == 0) {
    *in_RDI = *in_RDI + 1;
    local_1 = *in_RDI == *in_RCX;
  }
  else {
    bVar1 = isDigit((int)*(char *)*in_RDI,in_EDX);
    if (bVar1) {
      *in_RDI = *in_RDI + 1;
      if (*in_RDI == *in_RCX) {
        local_1 = true;
      }
      else if (*in_RDI + 1 == *in_RCX) {
        local_1 = false;
      }
      else {
        if (((int)*(char *)*in_RDI == (uint)in_SI) &&
           (bVar1 = isDigit((int)*(char *)(*in_RDI + 1),in_EDX), bVar1)) {
          *in_RDI = *in_RDI + 1;
        }
        local_1 = *in_RDI == *in_RCX;
      }
    }
    else {
      *in_RDI = *in_RDI + 1;
      local_1 = *in_RDI == *in_RCX;
    }
  }
  return local_1;
}

Assistant:

static bool Advance (Iterator* it, uc16 separator, int base, Iterator& end) {
  if (separator == StringToDoubleConverter::kNoSeparator) {
    ++(*it);
    return *it == end;
  }
  if (!isDigit(**it, base)) {
    ++(*it);
    return *it == end;
  }
  ++(*it);
  if (*it == end) return true;
  if (*it + 1 == end) return false;
  if (**it == separator && isDigit(*(*it + 1), base)) {
    ++(*it);
  }
  return *it == end;
}